

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_connecter_base.cpp
# Opt level: O3

int __thiscall zmq::stream_connecter_base_t::get_new_reconnect_ivl(stream_connecter_base_t *this)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  
  uVar3 = generate_random();
  uVar5 = (this->super_own_t).options.reconnect_ivl;
  iVar4 = (this->super_own_t).options.reconnect_ivl_max;
  iVar1 = this->_current_reconnect_ivl;
  if ((int)uVar5 < iVar4 && 0 < iVar4) {
    iVar2 = iVar1 * 2;
    if (SBORROW4(iVar4,iVar2) != iVar4 + iVar1 * -2 < 0) {
      iVar2 = (this->super_own_t).options.reconnect_ivl_max;
    }
    if (iVar1 < 0x3fffffff) {
      iVar4 = iVar2;
    }
    this->_current_reconnect_ivl = iVar4;
  }
  uVar5 = uVar3 % uVar5;
  iVar4 = uVar5 + iVar1;
  if ((int)(uVar5 ^ 0x7fffffff) <= iVar1) {
    iVar4 = 0x7fffffff;
  }
  return iVar4;
}

Assistant:

int zmq::stream_connecter_base_t::get_new_reconnect_ivl ()
{
    //  TODO should the random jitter be really based on the configured initial
    //  reconnect interval options.reconnect_ivl, or better on the
    //  _current_reconnect_ivl?

    //  The new interval is the current interval + random value.
    const int random_jitter = generate_random () % options.reconnect_ivl;
    const int interval =
      _current_reconnect_ivl < std::numeric_limits<int>::max () - random_jitter
        ? _current_reconnect_ivl + random_jitter
        : std::numeric_limits<int>::max ();

    //  Only change the new current reconnect interval if the maximum reconnect
    //  interval was set and if it's larger than the reconnect interval.
    if (options.reconnect_ivl_max > 0
        && options.reconnect_ivl_max > options.reconnect_ivl) {
        //  Calculate the next interval
        _current_reconnect_ivl =
          _current_reconnect_ivl < std::numeric_limits<int>::max () / 2
            ? std::min (_current_reconnect_ivl * 2, options.reconnect_ivl_max)
            : options.reconnect_ivl_max;
    }

    return interval;
}